

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::ElementsAddPeginWitness::ConvertFromStruct
          (ElementsAddPeginWitness *this,ElementsAddPeginWitnessStruct *data)

{
  ElementsAddPeginWitnessStruct *data_local;
  ElementsAddPeginWitness *this_local;
  
  this->amount_ = data->amount;
  std::__cxx11::string::operator=((string *)&this->asset_,(string *)&data->asset);
  std::__cxx11::string::operator=
            ((string *)&this->mainchain_genesis_block_hash_,
             (string *)&data->mainchain_genesis_block_hash);
  std::__cxx11::string::operator=((string *)&this->claim_script_,(string *)&data->claim_script);
  std::__cxx11::string::operator=
            ((string *)&this->mainchain_raw_transaction_,(string *)&data->mainchain_raw_transaction)
  ;
  std::__cxx11::string::operator=
            ((string *)&this->mainchain_txoutproof_,(string *)&data->mainchain_txoutproof);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void ElementsAddPeginWitness::ConvertFromStruct(
    const ElementsAddPeginWitnessStruct& data) {
  amount_ = data.amount;
  asset_ = data.asset;
  mainchain_genesis_block_hash_ = data.mainchain_genesis_block_hash;
  claim_script_ = data.claim_script;
  mainchain_raw_transaction_ = data.mainchain_raw_transaction;
  mainchain_txoutproof_ = data.mainchain_txoutproof;
  ignore_items = data.ignore_items;
}